

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void duckdb_parquet::swap(EncryptionWithColumnKey *a,EncryptionWithColumnKey *b)

{
  _EncryptionWithColumnKey__isset _Var1;
  
  std::swap<duckdb::vector<std::__cxx11::string,true>>(&a->path_in_schema,&b->path_in_schema);
  std::__cxx11::string::swap((string *)&a->key_metadata);
  _Var1 = a->__isset;
  a->__isset = b->__isset;
  b->__isset = _Var1;
  return;
}

Assistant:

void swap(EncryptionWithColumnKey &a, EncryptionWithColumnKey &b) {
  using ::std::swap;
  swap(a.path_in_schema, b.path_in_schema);
  swap(a.key_metadata, b.key_metadata);
  swap(a.__isset, b.__isset);
}